

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_io.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
draco::ReadMeshFromFile
          (string *file_name,Options *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mesh_files)

{
  bool bVar1;
  allocator<char> *paVar2;
  long in_RCX;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *in_RDI;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> statusor;
  Decoder decoder;
  DecoderBuffer buffer;
  vector<char,_std::allocator<char>_> file_data;
  StlDecoder stl_decoder;
  Status _local_status;
  PlyDecoder ply_decoder;
  Status obj_status;
  ObjDecoder obj_decoder;
  string extension;
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> mesh;
  undefined4 in_stack_fffffffffffffb18;
  Code in_stack_fffffffffffffb1c;
  ObjDecoder *in_stack_fffffffffffffb20;
  Mesh *in_stack_fffffffffffffb28;
  Mesh *in_stack_fffffffffffffb30;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  ObjDecoder *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined6 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7e;
  undefined1 in_stack_fffffffffffffb7f;
  DecoderBuffer *in_stack_fffffffffffffb90;
  Decoder *in_stack_fffffffffffffb98;
  allocator<char> local_421;
  string local_420 [32];
  string *in_stack_fffffffffffffc00;
  StlDecoder *in_stack_fffffffffffffc08;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> local_3d8 [4];
  allocator<char> local_2f9;
  string local_2f8 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  Status local_290 [2];
  uint local_21c;
  Status local_218;
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [32];
  ObjDecoder local_1a0;
  string local_58 [56];
  long local_20;
  
  local_20 = in_RCX;
  operator_new(0xd8);
  Mesh::Mesh(in_stack_fffffffffffffb30);
  std::unique_ptr<draco::Mesh,std::default_delete<draco::Mesh>>::
  unique_ptr<std::default_delete<draco::Mesh>,void>
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)in_stack_fffffffffffffb20
             ,(pointer)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  LowercaseFileExtension
            ((string *)
             CONCAT17(in_stack_fffffffffffffb7f,
                      CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb20,
                          (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  if (((bVar1) &&
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffb20,
                               (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)
                              ), bVar1)) && (local_20 != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb30,(value_type *)in_stack_fffffffffffffb28);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb20,
                          (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  if (bVar1) {
    ObjDecoder::ObjDecoder(in_stack_fffffffffffffb50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (allocator<char> *)in_stack_fffffffffffffb50);
    bVar1 = Options::GetBool((Options *)in_stack_fffffffffffffb28,
                             (string *)in_stack_fffffffffffffb20,
                             SUB41((uint)in_stack_fffffffffffffb1c >> 0x18,0));
    ObjDecoder::set_use_metadata(&local_1a0,bVar1);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (allocator<char> *)in_stack_fffffffffffffb50);
    bVar1 = Options::GetBool((Options *)in_stack_fffffffffffffb20,
                             (string *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)
                            );
    ObjDecoder::set_preserve_polygons(&local_1a0,bVar1);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::get
              ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
               in_stack_fffffffffffffb20);
    ObjDecoder::DecodeFromFile
              ((ObjDecoder *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
               (string *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb20);
    bVar1 = Status::ok(&local_218);
    if (bVar1) {
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb20,
                 (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    }
    else {
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb20,
                 (Status *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    }
    local_21c = 1;
    Status::~Status((Status *)0x112e60);
    ObjDecoder::~ObjDecoder(in_stack_fffffffffffffb20);
    goto LAB_0011342a;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb20,
                          (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  if (bVar1) {
    PlyDecoder::PlyDecoder((PlyDecoder *)in_stack_fffffffffffffb20);
    std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::get
              ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
               in_stack_fffffffffffffb20);
    PlyDecoder::DecodeFromFile
              ((PlyDecoder *)in_stack_fffffffffffffb28,(string *)in_stack_fffffffffffffb20,
               (Mesh *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    bVar1 = Status::ok(local_290);
    if (!bVar1) {
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb20,
                 (Status *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    }
    local_21c = (uint)!bVar1;
    Status::~Status((Status *)0x112f85);
    if (local_21c == 0) {
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb20,
                 (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      local_21c = 1;
    }
    PlyDecoder::~PlyDecoder((PlyDecoder *)0x112fc1);
    goto LAB_0011342a;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb20,
                          (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  if (bVar1) {
    StlDecoder::DecodeFromFile(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    local_21c = 1;
    goto LAB_0011342a;
  }
  this = &local_2b0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x11303d);
  bVar1 = ReadFileToBuffer((string *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                           (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffb30);
  if (bVar1) {
    DecoderBuffer::DecoderBuffer((DecoderBuffer *)in_stack_fffffffffffffb20);
    paVar2 = (allocator<char> *)
             std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1131a0);
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)&local_2b0);
    DecoderBuffer::Init((DecoderBuffer *)in_stack_fffffffffffffb20,
                        (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                        0x1131c4);
    Decoder::Decoder((Decoder *)in_stack_fffffffffffffb20);
    Decoder::DecodeMeshFromBuffer(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    bVar1 = StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::ok
                      ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
                       )0x113201);
    if (bVar1) {
      in_stack_fffffffffffffb30 =
           (Mesh *)StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::value
                             (local_3d8);
      bVar1 = std::operator==((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                              in_stack_fffffffffffffb20,
                              (nullptr_t)
                              CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      if (bVar1) goto LAB_0011323c;
      in_stack_fffffffffffffb20 =
           (ObjDecoder *)
           StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::value
                     (local_3d8);
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb20,
                 (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    }
    else {
LAB_0011323c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,in_stack_fffffffffffffb58,paVar2);
      Status::Status((Status *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                     (string *)0x113283);
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb20,
                 (Status *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      Status::~Status((Status *)0x1132a9);
      std::__cxx11::string::~string(local_420);
      std::allocator<char>::~allocator(&local_421);
    }
    local_21c = 1;
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::~StatusOr
              ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
               in_stack_fffffffffffffb20);
    Decoder::~Decoder((Decoder *)in_stack_fffffffffffffb20);
    DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x1133e1);
  }
  else {
    paVar2 = &local_2f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)paVar2,(allocator<char> *)in_stack_fffffffffffffb50);
    Status::Status((Status *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,(string *)0x1130aa)
    ;
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
               in_stack_fffffffffffffb20,
               (Status *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    Status::~Status((Status *)0x1130d0);
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    local_21c = 1;
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffb30);
LAB_0011342a:
  std::__cxx11::string::~string(local_58);
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::~unique_ptr
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)in_stack_fffffffffffffb20
            );
  return in_RDI;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> ReadMeshFromFile(
    const std::string &file_name, const Options &options,
    std::vector<std::string> *mesh_files) {
  std::unique_ptr<Mesh> mesh(new Mesh());
  // Analyze file extension.
  const std::string extension = LowercaseFileExtension(file_name);
  if (extension != "gltf" && extension != "obj" && mesh_files) {
    // The GLTF/OBJ decoder will fill |mesh_files|, but for other file types we
    // set the root file here to avoid duplicating code.
    mesh_files->push_back(file_name);
  }
  if (extension == "obj") {
    // Wavefront OBJ file format.
    ObjDecoder obj_decoder;
    obj_decoder.set_use_metadata(options.GetBool("use_metadata", false));
    obj_decoder.set_preserve_polygons(options.GetBool("preserve_polygons"));
    const Status obj_status =
        obj_decoder.DecodeFromFile(file_name, mesh.get(), mesh_files);
    if (!obj_status.ok()) {
      return obj_status;
    }
    return std::move(mesh);
  }
  if (extension == "ply") {
    // Stanford PLY file format.
    PlyDecoder ply_decoder;
    DRACO_RETURN_IF_ERROR(ply_decoder.DecodeFromFile(file_name, mesh.get()));
    return std::move(mesh);
  }
  if (extension == "stl") {
    // STL file format.
    StlDecoder stl_decoder;
    return stl_decoder.DecodeFromFile(file_name);
  }
#ifdef DRACO_TRANSCODER_SUPPORTED
  if (extension == "gltf" || extension == "glb") {
    GltfDecoder gltf_decoder;
    return gltf_decoder.DecodeFromFile(file_name, mesh_files);
  }
#endif

  // Otherwise not an obj file. Assume the file was encoded with one of the
  // draco encoding methods.
  std::vector<char> file_data;
  if (!ReadFileToBuffer(file_name, &file_data)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  DecoderBuffer buffer;
  buffer.Init(file_data.data(), file_data.size());
  Decoder decoder;
  auto statusor = decoder.DecodeMeshFromBuffer(&buffer);
  if (!statusor.ok() || statusor.value() == nullptr) {
    return Status(Status::DRACO_ERROR, "Error decoding input.");
  }
  return std::move(statusor).value();
}